

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DoubleField.cpp
# Opt level: O1

void __thiscall DoubleField::DoubleField(DoubleField *this,string *name,int size)

{
  pointer pcVar1;
  DoubleElement *pDVar2;
  int iVar3;
  string local_40;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + name->_M_string_length);
  Tag::Tag(&this->super_Tag,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_Tag).super_StreamObject._vptr_StreamObject = (_func_int **)&PTR_write_0010ad40;
  if (size == 0) {
    pDVar2 = (DoubleElement *)operator_new(0x48);
    DoubleElement::DoubleElement(pDVar2);
    Tag::addElement(&this->super_Tag,(StreamObject *)pDVar2);
  }
  else {
    iVar3 = size;
    if (0 < size) {
      do {
        pDVar2 = (DoubleElement *)operator_new(0x48);
        DoubleElement::DoubleElement(pDVar2);
        Tag::addElement(&this->super_Tag,(StreamObject *)pDVar2);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  }
  (this->super_Tag)._lineSize = 1;
  (this->super_Tag)._numberOfLines = size;
  return;
}

Assistant:

DoubleField::DoubleField( std::string name, int size ) : Tag( name )
{
	// we have to add at least one element
	if ( size == 0 )
	{
		addElement( new DoubleElement() );
	}
	else
	{
		for ( int i = 0; i < size; i++ )
		{
			addElement( new DoubleElement() );
		}
	}
	// We want to treat each element
	// as seperate line
	_lineSize = 1;
	_numberOfLines = size;
}